

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.hpp
# Opt level: O3

void benchmarks::detail::
     BenchmarksClassRegistrar<benchmarks::SignalBenchmarks,_descriptors::signal::boost::Tracking>::
     Register(BenchmarksMap *benchmarks)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar3;
  SignalBenchmarks<descriptors::signal::boost::Tracking> bm;
  undefined1 uStack_189;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  size_type local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  undefined8 local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_128;
  undefined8 local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  pointer local_e8;
  _Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
  *local_e0;
  pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_> local_d8;
  SignalBenchmarks<descriptors::signal::boost::Tracking> local_68;
  
  local_e0 = (_Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
              *)benchmarks;
  SignalBenchmarks<descriptors::signal::boost::Tracking>::SignalBenchmarks(&local_68);
  local_e8 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_d8.first._className.field_2;
    psVar3 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar2 = (psVar3->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this = (psVar3->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_168 = &local_158;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,local_68.super_BenchmarksClass._name._M_dataplus._M_p,
                 local_68.super_BenchmarksClass._name._M_dataplus._M_p +
                 local_68.super_BenchmarksClass._name._M_string_length);
      (*peVar2->_vptr_IBenchmark[2])(&local_188,peVar2);
      local_d8.first._className._M_string_length = local_160;
      local_d8.first._benchmarkName._M_string_length = local_180;
      if (local_168 == &local_158) {
        local_168 = &local_138;
        local_138._8_8_ = local_158._8_8_;
      }
      local_138._M_allocated_capacity._1_7_ = local_158._M_allocated_capacity._1_7_;
      local_138._M_local_buf[0] = local_158._M_local_buf[0];
      local_160 = 0;
      local_158._M_local_buf[0] = '\0';
      if (local_188 == &local_178) {
        local_188 = &local_118;
        local_118._8_8_ = local_178._8_8_;
      }
      local_118._M_allocated_capacity._1_7_ = local_178._M_allocated_capacity._1_7_;
      local_118._M_local_buf[0] = local_178._M_local_buf[0];
      local_180 = 0;
      local_178._M_local_buf[0] = '\0';
      local_d8.first._objectName.field_2._M_allocated_capacity = 0x72745f74736f6f62;
      uStack_f0 = CONCAT17(uStack_189,0x676e696b6361);
      local_148 = &local_138;
      local_d8.first._className._M_dataplus._M_p = (pointer)local_168;
      if (local_168 == local_148) {
        local_d8.first._className.field_2._8_8_ = local_138._8_8_;
        local_d8.first._className._M_dataplus._M_p = (pointer)paVar1;
      }
      local_d8.first._className.field_2._M_allocated_capacity = local_138._M_allocated_capacity;
      local_140 = 0;
      local_138._M_allocated_capacity = (ulong)(uint7)local_158._M_allocated_capacity._1_7_ << 8;
      local_128 = &local_118;
      local_d8.first._benchmarkName._M_dataplus._M_p = (pointer)local_188;
      if (local_188 == local_128) {
        local_d8.first._benchmarkName.field_2._8_8_ = local_118._8_8_;
        local_d8.first._benchmarkName._M_dataplus._M_p =
             (pointer)&local_d8.first._benchmarkName.field_2;
      }
      local_d8.first._benchmarkName.field_2._M_allocated_capacity = local_118._M_allocated_capacity;
      local_120 = 0;
      local_118._M_allocated_capacity = (ulong)(uint7)local_178._M_allocated_capacity._1_7_ << 8;
      local_d8.first._objectName._M_dataplus._M_p = (pointer)&local_d8.first._objectName.field_2;
      local_108 = &local_f8;
      local_d8.first._objectName._M_string_length = 0xe;
      local_100 = 0;
      local_f8 = 0x72745f74736f6f00;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_188 = &local_178;
      local_168 = &local_158;
      local_d8.first._objectName.field_2._8_8_ = uStack_f0;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar2;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this;
      std::
      _Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
      ::
      _M_insert_unique<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>
                (local_e0,&local_d8);
      if (local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.second.
                   super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._objectName._M_dataplus._M_p != &local_d8.first._objectName.field_2) {
        operator_delete(local_d8.first._objectName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._benchmarkName._M_dataplus._M_p !=
          &local_d8.first._benchmarkName.field_2) {
        operator_delete(local_d8.first._benchmarkName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._className._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.first._className._M_dataplus._M_p);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148);
      }
      if (local_188 != &local_178) {
        operator_delete(local_188);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != local_e8);
  }
  std::
  vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ::~vector(&local_68.super_BenchmarksClass._benchmarks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_BenchmarksClass._name._M_dataplus._M_p !=
      &local_68.super_BenchmarksClass._name.field_2) {
    operator_delete(local_68.super_BenchmarksClass._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void Register(BenchmarksMap& benchmarks)
			{
				BenchmarksClass_<ObjectsDescHead_> bm;
				for (auto b : bm.GetBenchmarks())
					benchmarks.insert({BenchmarkId(bm.GetName(), b->GetName(), ObjectsDescHead_::GetName()), b});

				BenchmarksClassRegistrar<BenchmarksClass_, ObjectsDescTail_...>::Register(benchmarks);
			}